

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O2

void __thiscall
Clasp::WeightConstraint::reason(WeightConstraint *this,Solver *s,Literal p,LitVec *r)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Literal local_2c;
  
  if ((int)*this->lits_ < 0) {
    if (p.rep_ >> 2 < (s->assign_).reason_.data_.ebo_.size) {
      uVar3 = (s->assign_).reason_.data_.ebo_.buf[p.rep_ >> 2];
    }
    else {
      uVar3 = 0xffffffff;
    }
  }
  else {
    uVar3 = *(uint *)&this->field_0x10 & 0x7ffffff;
  }
  for (uVar2 = (uint)*this->lits_ >> 0x1f; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = (uint)this->bound_[(ulong)uVar2 + 2] >> 1 & 1;
    if (uVar1 == (*(uint *)&this->field_0x10 >> 0x1c & 3)) {
      local_2c.rep_ =
           (uint)this->lits_
                 [(ulong)(((uint)this->bound_[(ulong)uVar2 + 2] >> 2) <<
                         (SUB41(*this->lits_,3) >> 7)) + 1] & 0xfffffffe ^ uVar1 * 2 ^ 2;
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back(r,&local_2c);
    }
  }
  return;
}

Assistant:

void WeightConstraint::reason(Solver& s, Literal p, LitVec& r) {
	assert(active_ != NOT_ACTIVE);
	Literal x;
	uint32 stop = !isWeight() ? up_ : s.reasonData(p);
	assert(stop <= up_);
	for (uint32 i = undoStart(); i != stop; ++i) {
		UndoInfo u = undo_[i];
		// Consider only lits that are relevant to the active constraint
		if (u.constraint() == (ActiveConstraint)active_) {
			x = lit(u.idx(), u.constraint());
			r.push_back( ~x );
		}
	}
}